

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.h
# Opt level: O2

void __thiscall dynet::SparseInputNode::~SparseInputNode(SparseInputNode *this)

{
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__SparseInputNode_0070fe70;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->data).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

explicit SparseInputNode(const Dim& d, const std::vector<unsigned int>& id,
                           const std::vector<float>& dat, float defdat = 0.f)
      : dim(d), ids(id), data(dat), defdata(defdat) {}